

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

Matrix_Sparse * __thiscall Disa::Matrix_Sparse::operator*=(Matrix_Sparse *this,Matrix_Sparse *other)

{
  double dVar1;
  pointer pdVar2;
  source_location *psVar3;
  bool bVar4;
  source_location *location;
  ostream *poVar5;
  size_t sVar6;
  size_t sVar7;
  size_t *psVar8;
  reference pvVar9;
  Scalar *pSVar10;
  undefined1 local_3a8 [56];
  pointer local_370;
  pointer *local_368;
  Scalar *value;
  size_t *i_column;
  size_t *i_row;
  value_type local_340;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_330;
  const_iterator local_320;
  value_type local_300;
  value_type local_2f0;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_2e0;
  undefined1 local_2d0 [8];
  const_iterator iter_element_other;
  undefined1 local_290 [8];
  iterator iter_element;
  value_type *iter_row;
  iterator __end1;
  iterator __begin1;
  Matrix_Sparse *__range1;
  pointer local_238;
  pointer local_230;
  pointer local_228;
  undefined1 local_220 [8];
  Matrix_Sparse copy;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Matrix_Sparse *local_18;
  Matrix_Sparse *other_local;
  Matrix_Sparse *this_local;
  
  psVar3 = (source_location *)this->column_size;
  local_18 = other;
  other_local = this;
  location = (source_location *)size_row(other);
  if (psVar3 != location) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001b5d78;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar5 = std::operator<<(poVar5,(string *)&local_38);
    sVar6 = size_row(this);
    std::__cxx11::to_string(&local_170,sVar6);
    std::operator+(&local_150,"Incompatible other dimensions, ",&local_170);
    std::operator+(&local_130,&local_150,",");
    sVar6 = size_column(this);
    std::__cxx11::to_string(&local_190,sVar6);
    std::operator+(&local_110,&local_130,&local_190);
    std::operator+(&local_f0,&local_110," vs. ");
    sVar6 = size_row(local_18);
    std::__cxx11::to_string(&local_1b0,sVar6);
    std::operator+(&local_d0,&local_f0,&local_1b0);
    std::operator+(&local_b0,&local_d0,",");
    sVar6 = size_column(local_18);
    std::__cxx11::to_string((string *)&copy.column_size,sVar6);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &copy.column_size);
    std::operator+(&local_70,&local_90,".");
    poVar5 = std::operator<<(poVar5,(string *)&local_70);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&copy.column_size);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  Matrix_Sparse((Matrix_Sparse *)local_220);
  local_228 = (pointer)size_row(this);
  sVar6 = size_non_zero(this);
  sVar7 = size_non_zero(local_18);
  local_230 = (pointer)(sVar6 + sVar7);
  reserve((Matrix_Sparse *)local_220,(size_t *)&local_228,(size_t *)&local_230);
  local_238 = (pointer)size_row(this);
  __range1 = (Matrix_Sparse *)size_column(local_18);
  resize((Matrix_Sparse *)local_220,(size_t *)&local_238,(size_t *)&__range1);
  std::swap<Disa::Matrix_Sparse>(this,(Matrix_Sparse *)local_220);
  begin((Matrix_Sparse *)&__end1.matrix_row.row_index);
  end((Matrix_Sparse *)&iter_row);
  while( true ) {
    bVar4 = Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator!=
                      ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)
                       &__end1.matrix_row.row_index,
                       (Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&iter_row);
    if (!bVar4) break;
    iter_element.matrix =
         (matrix_type *)
         Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator*<Disa::Matrix_Sparse,_true>
                   ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&__end1.matrix_row.row_index)
    ;
    Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin
              ((iterator *)local_290,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)iter_element.matrix);
    while( true ) {
      Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
                ((iterator *)&iter_element_other.matrix,
                 (Matrix_Sparse_Row<Disa::Matrix_Sparse> *)iter_element.matrix);
      bVar4 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator!=
                        ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_290,
                         (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                         &iter_element_other.matrix);
      if (!bVar4) break;
      local_300 = (value_type)begin(local_18);
      psVar8 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column
                         ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_290);
      local_2f0 = (value_type)
                  Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator+
                            ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_300,
                             *psVar8);
      local_2e0 = Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator*
                            ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_2f0);
      Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cbegin((const_iterator *)local_2d0,&local_2e0);
      while( true ) {
        _i_row = (value_type)begin(local_18);
        psVar8 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column
                           ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_290);
        local_340 = (value_type)
                    Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator+
                              ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&i_row,
                               *psVar8);
        local_330 = Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator*
                              ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_340);
        Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cend(&local_320,&local_330);
        bVar4 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                          ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_2d0,
                           &local_320);
        if (!bVar4) break;
        i_column = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row
                             ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_290);
        value = (Scalar *)
                Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column
                          ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_2d0);
        pvVar9 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
                 operator*<Disa::Matrix_Sparse,_true>
                           ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_290);
        dVar1 = *pvVar9;
        pSVar10 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator*
                            ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_2d0)
        ;
        local_370 = (pointer)(dVar1 * *pSVar10);
        local_368 = &local_370;
        bVar4 = contains(this,i_column,(size_t *)value);
        if (bVar4) {
          pdVar2 = *local_368;
          operator[]((Matrix_Sparse *)local_3a8,(size_t *)this);
          pSVar10 = Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                              ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_3a8,(size_t *)value);
          *pSVar10 = (double)pdVar2 + *pSVar10;
        }
        else {
          insert((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)
                 (local_3a8 + 0x10),this,i_column,(size_t *)value,(double *)local_368);
        }
        Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator++
                  ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_2d0);
      }
      Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator++
                ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_290);
    }
    Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator++
              ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&__end1.matrix_row.row_index);
  }
  shrink_to_fit(this);
  ~Matrix_Sparse((Matrix_Sparse *)local_220);
  return this;
}

Assistant:

Matrix_Sparse& Matrix_Sparse::operator*=(const Matrix_Sparse& other) {
  ASSERT_DEBUG(column_size == other.size_row(),
               "Incompatible other dimensions, " + std::to_string(size_row()) + "," + std::to_string(size_column()) +
               " vs. " + std::to_string(other.size_row()) + "," + std::to_string(other.size_column()) + ".");
  Matrix_Sparse copy;
  copy.reserve(size_row(), size_non_zero() + other.size_non_zero());
  copy.resize(size_row(), other.size_column());
  std::swap(*this, copy);
  FOR_EACH_REF(iter_row, copy) {
    FOR_ITER_REF(iter_element, iter_row) {
      FOR_ITER(iter_element_other, *(other.begin() + iter_element.i_column())) {
        const std::size_t& i_row = iter_element.i_row();
        const std::size_t& i_column = iter_element_other.i_column();
        const Scalar& value = (*iter_element) * (*iter_element_other);
        if(!contains(i_row, i_column)) insert(i_row, i_column, value);
        else (*this)[i_row][i_column] += value;
      }
    }
  }
  shrink_to_fit();
  return *this;
}